

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

int Cba_ObjSigned(Cba_Ntk_t *p,int i)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = Cba_ObjFon0(p,i);
  if (-1 < iVar1) {
    iVar1 = Cba_FonRangeId(p,iVar1);
    iVar1 = Abc_LitIsCompl(iVar1);
    return iVar1;
  }
  iVar1 = Cba_FonConst(iVar1);
  pcVar2 = Cba_NtkConst(p,iVar1);
  pcVar2 = strchr(pcVar2,0x73);
  return (int)(pcVar2 != (char *)0x0);
}

Assistant:

static inline int            Cba_ObjSigned( Cba_Ntk_t * p, int i )           { return Cba_FonSigned( p, Cba_ObjFon0(p, i) );                                               }